

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessorTests.cpp
# Opt level: O3

void __thiscall
solitaire::events::EventsProcessorTests_trySelectNextStockPileCardOnLeftButtonDownEvent_Test::
TestBody(EventsProcessorTests_trySelectNextStockPileCardOnLeftButtonDownEvent_Test *this)

{
  _Variadic_union<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
  local_20;
  undefined1 local_18;
  
  local_20 = (_Variadic_union<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
              )0x3300000018;
  local_18 = 1;
  EventsProcessorTests::expectEvent(&this->super_EventsProcessorTests,(Event *)&local_20);
  EventsProcessorTests::ignoreLeftButtonDownOnButtons(&this->super_EventsProcessorTests);
  EventsProcessorTests::ignoreLeftButtonDownOnFoundationPilesFromFirstTo
            (&this->super_EventsProcessorTests,4);
  EventsProcessorTests::ignoreLeftButtonDownOnTableauPilesFromFirstTo
            (&this->super_EventsProcessorTests,7);
  EventsProcessorTests::expectGetStockPileCollider(&this->super_EventsProcessorTests);
  EventsProcessorTests::acceptLeftButtonDownOnCoveredStockPileCards
            (&this->super_EventsProcessorTests,
             (MouseLeftButtonDown *)&(anonymous_namespace)::mouseLeftButtonDownEvent);
  local_18 = 4;
  EventsProcessorTests::expectEvent(&this->super_EventsProcessorTests,(Event *)&local_20);
  EventsProcessor::processEvents(&(this->super_EventsProcessorTests).eventsProcessor);
  return;
}

Assistant:

TEST_F(EventsProcessorTests,
       trySelectNextStockPileCardOnLeftButtonDownEvent)
{
    expectEvent(mouseLeftButtonDownEvent);
    ignoreLeftButtonDownOnButtons();
    ignoreLeftButtonDownOnFoundationPilesFromFirstTo(foundationPilesCount);
    ignoreLeftButtonDownOnTableauPilesFromFirstTo(tableauPilesCount);
    expectGetStockPileCollider();
    acceptLeftButtonDownOnCoveredStockPileCards(mouseLeftButtonDownEvent);
    expectEvent(Quit {});
    eventsProcessor.processEvents();
}